

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O1

void xPredIntraAngAdi_X(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int imult;
  
  if (0 < height) {
    cVar1 = tab_auc_dir_dxdy[0][mode][0];
    bVar2 = tab_auc_dir_dxdy[0][mode][1];
    uVar3 = (ulong)(width * 2);
    iVar7 = 0;
    do {
      iVar7 = iVar7 + 1;
      iVar9 = iVar7 * cVar1;
      iVar4 = iVar9 >> (bVar2 & 0x1f);
      iVar10 = (iVar9 * 0x20 >> (bVar2 & 0x1f)) + iVar4 * -0x20;
      iVar9 = width * 2 - iVar4;
      uVar6 = (ulong)(iVar9 + 1);
      if (width <= iVar9) {
        uVar6 = (ulong)(uint)width;
      }
      uVar5 = 0;
      iVar9 = (int)uVar6;
      if (0 < iVar9) {
        lVar8 = (long)iVar4;
        uVar5 = 0;
        do {
          dst[uVar5] = (pel)((uint)src[uVar5 + lVar8 + 2] * (iVar10 + 0x20) +
                             (uint)src[uVar5 + lVar8 + 1] * (0x40 - iVar10) +
                             (uint)src[uVar5 + lVar8] * (0x20 - iVar10) +
                             (uint)src[uVar5 + lVar8 + 3] * iVar10 + 0x40 >> 7);
          uVar5 = uVar5 + 1;
        } while (uVar6 != uVar5);
      }
      if (iVar9 < 1) {
        *dst = (pel)((iVar10 + 0x20) * (uint)src[uVar3 + 2] +
                     (0x40 - iVar10) * (uint)src[uVar3 | 1] + (0x20 - iVar10) * (uint)src[uVar3] +
                     iVar10 * (uint)src[uVar3 + 3] + 0x40 >> 7);
        iVar9 = 1;
      }
      if ((int)uVar5 < width) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          dst[uVar5] = dst[iVar9 - 1];
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      dst = dst + i_dst;
    } while (iVar7 != height);
  }
  return;
}

Assistant:

static void xPredIntraAngAdi_X(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    int offset;
    int width2 = width << 1;

    for (j = 0; j < height; j++) {
        int c1, c2, c3, c4;
        int idx = getContextPixel(mode, 0, j + 1, &offset);
        int pred_width = COM_MIN(width, width2 - idx + 1);

        c1 = 32 - offset;
        c2 = 64 - offset;
        c3 = 32 + offset;
        c4 = offset;

        for (i = 0; i < pred_width; i++, idx++) {
            dst[i] = (src[idx] * c1 + src[idx + 1] * c2 + src[idx + 2] * c3 + src[idx + 3] * c4 + 64) >> 7;
        }
        if (pred_width <= 0) {
            dst[0] = (src[width2] * c1 + src[width2 + 1] * c2 + src[width2 + 2] * c3 + src[width2 + 3] * c4 + 64) >> 7;
            pred_width = 1;
        }
        for (; i < width; i++) {
            dst[i] = dst[pred_width - 1];
        }
        dst += i_dst;
    }
}